

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O2

vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *
deqp::gles2::Functional::anon_unknown_0::getPointsFromSamples
          (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
           *__return_storage_ptr__,
          vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
          *samples,offset_in_Sample_to_unknown field)

{
  pointer pSVar1;
  ulong uVar2;
  pointer pVVar3;
  long lVar4;
  ulong uVar5;
  allocator_type local_21;
  
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (__return_storage_ptr__,
             ((long)(samples->
                    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18,&local_21);
  lVar4 = 0;
  for (uVar5 = 0;
      pSVar1 = (samples->
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(samples->
                             super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x18);
      uVar5 = uVar5 + 1) {
    uVar2 = *(ulong *)((long)&pSVar1->numDrawCalls + field + lVar4);
    pVVar3 = (__return_storage_ptr__->
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar3[uVar5].m_data[0] = (float)*(int *)((long)&pSVar1->numDrawCalls + lVar4);
    pVVar3[uVar5].m_data[1] = (float)uVar2;
    lVar4 = lVar4 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vec2> getPointsFromSamples (const std::vector<FlushFinishCase::Sample>& samples, const deUint64 FlushFinishCase::Sample::*field)
{
	vector<Vec2> points(samples.size());

	for (size_t ndx = 0; ndx < samples.size(); ndx++)
		points[ndx] = Vec2(float(samples[ndx].numDrawCalls), float(samples[ndx].*field));

	return points;
}